

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O0

void __thiscall QBindingStoragePrivate::destroy(QBindingStoragePrivate *this)

{
  undefined8 *in_RDI;
  size_t allocSize;
  size_t i;
  Pair *p;
  ulong local_18;
  Pair *local_10;
  
  if (*(long *)*in_RDI != 0) {
    local_10 = pairs(*(QBindingStorageData **)*in_RDI);
    for (local_18 = 0; local_18 < **(ulong **)*in_RDI; local_18 = local_18 + 1) {
      if (local_10->data != (QUntypedPropertyData *)0x0) {
        Pair::~Pair((Pair *)0x418bca);
      }
      local_10 = local_10 + 1;
    }
    QtPrivate::sizedFree((void *)(**(long **)*in_RDI * 0x10 + 0x10),(size_t)in_RDI);
  }
  return;
}

Assistant:

void destroy()
    {
        if (!d)
            return;
        Pair *p = pairs(d);
        for (size_t i = 0; i < d->size; ++i) {
            if (p->data)
                p->~Pair();
            ++p;
        }
        const size_t allocSize = sizeof(QBindingStorageData) + d->size*sizeof(Pair);
        QtPrivate::sizedFree(d, allocSize);
    }